

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O1

bool __thiscall RTIMUGD20HM303D::setGyroCTRL5(RTIMUGD20HM303D *this)

{
  bool bVar1;
  
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'$','\x10',"Failed to set L3GD20H CTRL5");
  return bVar1;
}

Assistant:

bool RTIMUGD20HM303D::setGyroCTRL5()
{
    unsigned char ctrl5;

    //  Turn on hpf

    ctrl5 = 0x10;

#ifdef GD20HM303D_CACHE_MODE
    //  turn on fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_gyroSlaveAddr,  L3GD20H_CTRL5, ctrl5, "Failed to set L3GD20H CTRL5");
}